

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_hugehelp.c
# Opt level: O0

void hugehelp(void)

{
  int iVar1;
  void *__ptr;
  uchar *local_88;
  z_stream z;
  int status;
  uchar *buf;
  
  memset(&local_88,0,0x70);
  z.state = (internal_state *)zalloc_func;
  z.zalloc = zfree_func;
  z.next_in._0_4_ = 0x130bf;
  local_88 = hugehelpgz + 10;
  iVar1 = inflateInit2_(&local_88,0xfffffff1,"1.2.11",0x70);
  if (iVar1 == 0) {
    __ptr = malloc(0x10000);
    if (__ptr != (void *)0x0) {
      do {
        z.next_out._0_4_ = 0x10000;
        z.total_in = (uLong)__ptr;
        z.reserved._4_4_ = inflate(&local_88,2);
        if ((z.reserved._4_4_ != 0) && (z.reserved._4_4_ != 1)) break;
        fwrite(__ptr,(ulong)(0x10000 - (int)z.next_out),1,_stdout);
      } while (z.reserved._4_4_ != 1);
      free(__ptr);
    }
    inflateEnd(&local_88);
  }
  return;
}

Assistant:

void hugehelp(void)
{
  unsigned char *buf;
  int status;
  z_stream z;

  /* Make sure no gzip options are set */
  if(hugehelpgz[3] & 0xfe)
    return;

  memset(&z, 0, sizeof(z_stream));
  z.zalloc = (alloc_func)zalloc_func;
  z.zfree = (free_func)zfree_func;
  z.avail_in = (uInt)(sizeof(hugehelpgz) - HEADERLEN);
  z.next_in = (z_const Bytef *)hugehelpgz + HEADERLEN;

  if(inflateInit2(&z, -MAX_WBITS) != Z_OK)
    return;

  buf = malloc(BUF_SIZE);
  if(buf) {
    while(1) {
      z.avail_out = BUF_SIZE;
      z.next_out = buf;
      status = inflate(&z, Z_SYNC_FLUSH);
      if(status == Z_OK || status == Z_STREAM_END) {
        fwrite(buf, BUF_SIZE - z.avail_out, 1, stdout);
        if(status == Z_STREAM_END)
          break;
      }
      else
        break;    /* error */
    }
    free(buf);
  }
  inflateEnd(&z);
}